

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  ArenaImpl *this_00;
  Rep *pRVar1;
  int iVar2;
  Extension *pEVar3;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar4;
  undefined4 extraout_var;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar6;
  MessageLite *pMVar5;
  
  pVar6 = Insert(this,number);
  pEVar3 = pVar6.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pEVar3->type = type;
    pEVar3->is_repeated = true;
    this_00 = (ArenaImpl *)this->arena_;
    if (this_00 == (ArenaImpl *)0x0) {
      pRVar4 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x18);
      (pRVar4->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (pRVar4->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar4->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar4->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    else {
      if ((this_00->lifecycle_id_ & 1) != 0) {
        AddMessage((ExtensionSet *)this_00);
      }
      pRVar4 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)ArenaImpl::AllocateAlignedAndAddCleanup
                            (this_00,0x18,
                             arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                            );
      (pRVar4->super_RepeatedPtrFieldBase).arena_ = (Arena *)this_00;
      (pRVar4->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar4->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar4->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    (pEVar3->field_0).repeated_string_value = pRVar4;
  }
  pRVar4 = (pEVar3->field_0).repeated_string_value;
  pRVar1 = (pRVar4->super_RepeatedPtrFieldBase).rep_;
  if (pRVar1 != (Rep *)0x0) {
    iVar2 = (pRVar4->super_RepeatedPtrFieldBase).current_size_;
    if (iVar2 < pRVar1->allocated_size) {
      (pRVar4->super_RepeatedPtrFieldBase).current_size_ = iVar2 + 1;
      pMVar5 = (MessageLite *)pRVar1->elements[iVar2];
      goto LAB_002012a8;
    }
  }
  pMVar5 = (MessageLite *)0x0;
LAB_002012a8:
  if (pMVar5 == (MessageLite *)0x0) {
    iVar2 = (*prototype->_vptr_MessageLite[4])(prototype,this->arena_);
    pMVar5 = (MessageLite *)CONCAT44(extraout_var,iVar2);
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              ((RepeatedPtrFieldBase *)(pEVar3->field_0).int64_value,pMVar5);
  }
  return pMVar5;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  // RepeatedPtrField<MessageLite> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                            extension->repeated_message_value)
                            ->AddFromCleared<GenericTypeHandler<MessageLite>>();
  if (result == NULL) {
    result = prototype.New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}